

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O3

void FAudio_INTERNAL_Mix_2in_6out_Scalar
               (uint32_t toMix,uint32_t UNUSED1,uint32_t UNUSED2,float *src,float *dst,
               float *coefficients)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  long lVar15;
  
  if (toMix != 0) {
    fVar1 = coefficients[6];
    fVar2 = coefficients[4];
    fVar3 = *coefficients;
    fVar4 = coefficients[1];
    fVar5 = coefficients[2];
    fVar6 = coefficients[3];
    fVar7 = coefficients[7];
    fVar8 = coefficients[5];
    fVar9 = coefficients[10];
    fVar10 = coefficients[8];
    fVar11 = coefficients[0xb];
    fVar12 = coefficients[9];
    lVar15 = 0;
    do {
      fVar13 = src[lVar15 * 2];
      fVar14 = src[lVar15 * 2 + 1];
      *dst = *dst + fVar13 * fVar3 + fVar14 * fVar4;
      dst[1] = dst[1] + fVar13 * fVar5 + fVar14 * fVar6;
      dst[2] = dst[2] + fVar13 * fVar2 + fVar14 * fVar8;
      dst[3] = dst[3] + fVar13 * fVar1 + fVar14 * fVar7;
      *(ulong *)(dst + 4) =
           CONCAT44((float)((ulong)*(undefined8 *)(dst + 4) >> 0x20) +
                    fVar13 * fVar9 + fVar14 * fVar11,
                    (float)*(undefined8 *)(dst + 4) + fVar13 * fVar10 + fVar14 * fVar12);
      dst = dst + 6;
      lVar15 = lVar15 + 1;
    } while (toMix != (uint32_t)lVar15);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_2in_6out_Scalar(
	uint32_t toMix,
	uint32_t UNUSED1,
	uint32_t UNUSED2,
	float *restrict src,
	float *restrict dst,
	float *restrict coefficients
) {
	uint32_t i;
	for (i = 0; i < toMix; i += 1, src += 2, dst += 6)
	{
		dst[0] += (
			(src[0] * coefficients[0]) +
			(src[1] * coefficients[1])
		);
		dst[1] += (
			(src[0] * coefficients[2]) +
			(src[1] * coefficients[3])
		);
		dst[2] += (
			(src[0] * coefficients[4]) +
			(src[1] * coefficients[5])
		);
		dst[3] += (
			(src[0] * coefficients[6]) +
			(src[1] * coefficients[7])
		);
		dst[4] += (
			(src[0] * coefficients[8]) +
			(src[1] * coefficients[9])
		);
		dst[5] += (
			(src[0] * coefficients[10]) +
			(src[1] * coefficients[11])
		);
	}
}